

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cc
# Opt level: O3

void predict_or_learn<true>(char *param_1,single_learner *base,example *ec)

{
  float fVar1;
  float fVar2;
  ostream *poVar3;
  
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20));
  fVar1 = (ec->l).simple.label;
  fVar2 = *(float *)(&DAT_0028d4a4 + (ulong)(0.0 < (ec->pred).scalar) * 4);
  (ec->pred).scalar = fVar2;
  if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
    if ((ABS(fVar1) != 1.0) || (NAN(ABS(fVar1)))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"You are using label ",0x14);
      poVar3 = std::ostream::_M_insert<double>((double)(ec->l).simple.label);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," not -1 or 1 as loss function expects!",0x26);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      return;
    }
    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
      ec->loss = ec->weight;
    }
    else {
      ec->loss = 0.0;
    }
  }
  return;
}

Assistant:

void predict_or_learn(char&, LEARNER::single_learner& base, example& ec)
{
  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);

  if (ec.pred.scalar > 0)
    ec.pred.scalar = 1;
  else
    ec.pred.scalar = -1;

  if (ec.l.simple.label != FLT_MAX)
  {
    if (fabs(ec.l.simple.label) != 1.f)
      cout << "You are using label " << ec.l.simple.label << " not -1 or 1 as loss function expects!" << endl;
    else if (ec.l.simple.label == ec.pred.scalar)
      ec.loss = 0.;
    else
      ec.loss = ec.weight;
  }
}